

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

void __thiscall Camera::input(Camera *this,string *var,stringstream *fin)

{
  int iVar1;
  char *ctx;
  
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    operator>>(fin,&this->O);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    operator>>(fin,&this->N);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    operator>>(fin,&this->Dx);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    std::istream::_M_extract<double>((double *)fin);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    std::istream::_M_extract<double>((double *)fin);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    std::istream::operator>>((istream *)fin,&this->W);
  }
  ctx = "image_H=";
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    ctx = (char *)&this->H;
    std::istream::operator>>((istream *)fin,(int *)ctx);
  }
  init(this,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

void Camera::input(const std::string &var, std::stringstream &fin) {
    if ( var == "O=" ) fin >> O;
    if ( var == "N=" ) fin >> N;
    if ( var == "Dx=" ) fin >> Dx;
    if ( var == "lens_W=" ) fin >> lens_W;
    if ( var == "lens_H=" ) fin >> lens_H;
    if ( var == "image_W=" ) fin >> W;
    if ( var == "image_H=" ) fin >> H;
    init();
}